

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geofile_operations.cpp
# Opt level: O1

void __thiscall GEO::geofile::make_coherent(geofile *this,bool *detailed)

{
  _Rb_tree_header *p_Var1;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *this_00;
  long lVar2;
  int iVar3;
  _Base_ptr p_Var4;
  _Rb_tree_node_base *p_Var5;
  _Rb_tree_node_base *p_Var6;
  _Base_ptr p_Var7;
  _Base_ptr p_Var8;
  ulong uVar9;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var10;
  _Self __tmp_14;
  _Self __tmp_1;
  _Self __tmp;
  _Self __tmp_5;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::_Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  pVar11;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_int>_>,_std::_Rb_tree_iterator<std::pair<const_int,_int>_>_>
  pVar12;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> changes;
  pair<const_int,_int> local_108;
  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  *local_100;
  geofile *local_f8;
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  local_f0;
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  local_c0;
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  local_90;
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  local_60;
  
  coherent_points(this);
  coherent_lines(this);
  if (*detailed == true) {
    local_f0._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_f0._M_impl.super__Rb_tree_header._M_header;
    local_f0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_f0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_f0._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_100 = &this->curve_loops_map;
    local_f8 = this;
    local_f0._M_impl.super__Rb_tree_header._M_header._M_right =
         local_f0._M_impl.super__Rb_tree_header._M_header._M_left;
    if ((this->curve_loops_map)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      p_Var1 = &(this->curve_loops_map)._M_t._M_impl.super__Rb_tree_header;
      p_Var4 = (_Base_ptr)std::_Rb_tree_decrement(&p_Var1->_M_header);
      p_Var7 = (this->curve_loops_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      if (p_Var7 != p_Var4) {
        do {
          p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7);
          if ((_Rb_tree_header *)p_Var5 != p_Var1) {
            do {
              iVar3 = compare_vector((vector<int,_std::allocator<int>_> *)&p_Var7[1]._M_parent,
                                     (vector<int,_std::allocator<int>_> *)&p_Var5[1]._M_parent);
              if (iVar3 == 1) {
                p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_decrement(p_Var5);
                local_108.first = p_Var5[1]._M_color;
                local_108.second = p_Var7[1]._M_color;
                std::
                _Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
                ::_M_insert_unique<std::pair<int_const,int>>
                          ((_Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
                            *)&local_f0,&local_108);
                pVar11 = std::
                         _Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                         ::equal_range(&local_100->_M_t,(key_type *)(p_Var5 + 1));
                std::
                _Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                ::_M_erase_aux(&local_100->_M_t,(_Base_ptr)pVar11.first._M_node,
                               (_Base_ptr)pVar11.second._M_node);
                p_Var5 = p_Var6;
LAB_001306a8:
                p_Var4 = (_Base_ptr)std::_Rb_tree_decrement(&p_Var1->_M_header);
              }
              else if (iVar3 == 2) {
                p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_decrement(p_Var5);
                local_108.second = -p_Var7[1]._M_color;
                local_108.first = p_Var5[1]._M_color;
                std::
                _Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
                ::_M_insert_unique<std::pair<int_const,int>>
                          ((_Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
                            *)&local_f0,&local_108);
                pVar11 = std::
                         _Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                         ::equal_range(&local_100->_M_t,(key_type *)(p_Var5 + 1));
                std::
                _Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                ::_M_erase_aux(&local_100->_M_t,(_Base_ptr)pVar11.first._M_node,
                               (_Base_ptr)pVar11.second._M_node);
                p_Var5 = p_Var6;
                goto LAB_001306a8;
              }
              p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
            } while ((_Rb_tree_header *)p_Var5 != p_Var1);
          }
          p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
        } while (p_Var7 != p_Var4);
      }
      std::
      _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
      ::_Rb_tree(&local_60,&local_f0);
      this = local_f8;
      adjust_curve_loops(local_f8,(map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                   *)&local_60);
      std::
      _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
      ::~_Rb_tree(&local_60);
      std::
      _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
      ::clear(&local_f0);
    }
    if ((this->plane_surfaces_map)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      p_Var1 = &(this->plane_surfaces_map)._M_t._M_impl.super__Rb_tree_header;
      p_Var4 = (_Base_ptr)std::_Rb_tree_decrement(&p_Var1->_M_header);
      p_Var7 = (this->plane_surfaces_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      if (p_Var7 != p_Var4) {
        this_00 = &local_f8->plane_surfaces_map;
        p_Var8 = p_Var7;
        do {
          while (p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8),
                (_Rb_tree_header *)p_Var5 != p_Var1) {
            p_Var8 = p_Var5;
            if (*(int *)&p_Var7[1].field_0x4 == *(int *)&p_Var5[1].field_0x4) {
              p_Var8 = (_Base_ptr)std::_Rb_tree_decrement(p_Var5);
              local_108.first = p_Var5[1]._M_color;
              local_108.second = p_Var7[1]._M_color;
              std::
              _Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
              ::_M_insert_unique<std::pair<int_const,int>>
                        ((_Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
                          *)&local_f0,&local_108);
              pVar12 = std::
                       _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                       ::equal_range(&this_00->_M_t,(key_type *)(p_Var5 + 1));
              std::
              _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
              ::_M_erase_aux(&this_00->_M_t,(_Base_ptr)pVar12.first._M_node,
                             (_Base_ptr)pVar12.second._M_node);
              p_Var4 = (_Base_ptr)std::_Rb_tree_decrement(&p_Var1->_M_header);
            }
          }
          p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
          p_Var8 = p_Var7;
        } while (p_Var7 != p_Var4);
      }
      std::
      _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
      ::_Rb_tree(&local_90,&local_f0);
      this = local_f8;
      adjust_plane_surfaces
                (local_f8,(map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                           *)&local_90);
      std::
      _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
      ::~_Rb_tree(&local_90);
      std::
      _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
      ::clear(&local_f0);
    }
    if ((this->surface_loops_map)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      p_Var1 = &(this->surface_loops_map)._M_t._M_impl.super__Rb_tree_header;
      p_Var4 = (_Base_ptr)std::_Rb_tree_decrement(&p_Var1->_M_header);
      p_Var7 = (this->surface_loops_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      if (p_Var7 != p_Var4) {
        do {
          p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7);
          if ((_Rb_tree_header *)p_Var5 != p_Var1) {
            do {
              iVar3 = compare_vector((vector<int,_std::allocator<int>_> *)&p_Var7[1]._M_parent,
                                     (vector<int,_std::allocator<int>_> *)&p_Var5[1]._M_parent);
              if (iVar3 == 1) {
                p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_decrement(p_Var5);
                local_108.first = p_Var5[1]._M_color;
                local_108.second = p_Var7[1]._M_color;
                std::
                _Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
                ::_M_insert_unique<std::pair<int_const,int>>
                          ((_Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
                            *)&local_f0,&local_108);
                pVar11 = std::
                         _Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                         ::equal_range(&local_100->_M_t,(key_type *)(p_Var5 + 1));
                std::
                _Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                ::_M_erase_aux(&local_100->_M_t,(_Base_ptr)pVar11.first._M_node,
                               (_Base_ptr)pVar11.second._M_node);
                p_Var5 = p_Var6;
LAB_001308f6:
                p_Var4 = (_Base_ptr)std::_Rb_tree_decrement(&p_Var1->_M_header);
              }
              else if (iVar3 == 2) {
                p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_decrement(p_Var5);
                local_108.second = -p_Var7[1]._M_color;
                local_108.first = p_Var5[1]._M_color;
                std::
                _Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
                ::_M_insert_unique<std::pair<int_const,int>>
                          ((_Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
                            *)&local_f0,&local_108);
                pVar11 = std::
                         _Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                         ::equal_range(&local_100->_M_t,(key_type *)(p_Var5 + 1));
                std::
                _Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                ::_M_erase_aux(&local_100->_M_t,(_Base_ptr)pVar11.first._M_node,
                               (_Base_ptr)pVar11.second._M_node);
                p_Var5 = p_Var6;
                goto LAB_001308f6;
              }
              p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
            } while ((_Rb_tree_header *)p_Var5 != p_Var1);
          }
          p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
        } while (p_Var7 != p_Var4);
      }
      std::
      _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
      ::_Rb_tree(&local_c0,&local_f0);
      this = local_f8;
      adjust_surface_loops
                (local_f8,(map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                           *)&local_c0);
      std::
      _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
      ::~_Rb_tree(&local_c0);
      std::
      _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
      ::clear(&local_f0);
    }
    for (p_Var5 = (this->physical_curves_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var5 != &(this->physical_curves_map)._M_t._M_impl.super__Rb_tree_header
        ; p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
      p_Var7 = *(_Base_ptr *)(p_Var5 + 2);
      p_Var4 = p_Var5[2]._M_parent;
      if (p_Var7 != p_Var4) {
        uVar9 = (long)p_Var4 - (long)p_Var7 >> 2;
        lVar2 = 0x3f;
        if (uVar9 != 0) {
          for (; uVar9 >> lVar2 == 0; lVar2 = lVar2 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                  (p_Var7,p_Var4,((uint)lVar2 ^ 0x3f) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  (p_Var7,p_Var4);
      }
      _Var10 = std::
               __unique<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                         (*(undefined8 *)(p_Var5 + 2),p_Var5[2]._M_parent);
      if (((_Base_ptr)_Var10._M_current != p_Var5[2]._M_parent) &&
         (p_Var7 = (_Base_ptr)
                   ((long)_Var10._M_current +
                   ((long)p_Var5[2]._M_parent - (long)p_Var5[2]._M_parent)),
         p_Var5[2]._M_parent != p_Var7)) {
        p_Var5[2]._M_parent = p_Var7;
      }
    }
    for (p_Var5 = (this->physical_surfaces_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left
        ; (_Rb_tree_header *)p_Var5 !=
          &(this->physical_surfaces_map)._M_t._M_impl.super__Rb_tree_header;
        p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
      p_Var7 = *(_Base_ptr *)(p_Var5 + 2);
      p_Var4 = p_Var5[2]._M_parent;
      if (p_Var7 != p_Var4) {
        uVar9 = (long)p_Var4 - (long)p_Var7 >> 2;
        lVar2 = 0x3f;
        if (uVar9 != 0) {
          for (; uVar9 >> lVar2 == 0; lVar2 = lVar2 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                  (p_Var7,p_Var4,((uint)lVar2 ^ 0x3f) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  (p_Var7,p_Var4);
      }
      _Var10 = std::
               __unique<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                         (*(undefined8 *)(p_Var5 + 2),p_Var5[2]._M_parent);
      if (((_Base_ptr)_Var10._M_current != p_Var5[2]._M_parent) &&
         (p_Var7 = (_Base_ptr)
                   ((long)_Var10._M_current +
                   ((long)p_Var5[2]._M_parent - (long)p_Var5[2]._M_parent)),
         p_Var5[2]._M_parent != p_Var7)) {
        p_Var5[2]._M_parent = p_Var7;
      }
    }
    for (p_Var5 = (this->physical_volumes_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var5 !=
        &(this->physical_volumes_map)._M_t._M_impl.super__Rb_tree_header;
        p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
      p_Var7 = *(_Base_ptr *)(p_Var5 + 2);
      p_Var4 = p_Var5[2]._M_parent;
      if (p_Var7 != p_Var4) {
        uVar9 = (long)p_Var4 - (long)p_Var7 >> 2;
        lVar2 = 0x3f;
        if (uVar9 != 0) {
          for (; uVar9 >> lVar2 == 0; lVar2 = lVar2 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                  (p_Var7,p_Var4,((uint)lVar2 ^ 0x3f) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  (p_Var7,p_Var4);
      }
      _Var10 = std::
               __unique<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                         (*(undefined8 *)(p_Var5 + 2),p_Var5[2]._M_parent);
      if (((_Base_ptr)_Var10._M_current != p_Var5[2]._M_parent) &&
         (p_Var7 = (_Base_ptr)
                   ((long)_Var10._M_current +
                   ((long)p_Var5[2]._M_parent - (long)p_Var5[2]._M_parent)),
         p_Var5[2]._M_parent != p_Var7)) {
        p_Var5[2]._M_parent = p_Var7;
      }
    }
    std::
    _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
    ::~_Rb_tree(&local_f0);
  }
  return;
}

Assistant:

void GEO::geofile::make_coherent(const bool &detailed)
{
    // start_timer();                                                                      //DEBUG
    coherent_points();
    // std::cout << std::endl;                                                             //DEBUG
    // std::cout << "Time: coherent_points = " << get_microseconds()/1e3 << std::endl;     //DEBUG
    // start_timer();                                                                      //DEBUG
    coherent_lines();
    // std::cout << "Time: coherent_lines = " << get_microseconds()/1e3 << std::endl;      //DEBUG
    // start_timer();                                                                      //DEBUG
    if ( detailed==true)
    {
        std::map<int,int> changes;
        // ------- Search for duplicated curve loops --------
        if (!curve_loops_map.empty())
        {
            auto main_cl_loop_end = std::prev(curve_loops_map.end());
            for (auto main_cl_loop_it = curve_loops_map.begin();
                main_cl_loop_it != main_cl_loop_end;
                main_cl_loop_it++)
            {
                auto inner_cl_loop_end = curve_loops_map.end();
                auto cl_p_holder = main_cl_loop_it; cl_p_holder++;
                for (auto inner_cl_loop_it = cl_p_holder;
                    inner_cl_loop_it != inner_cl_loop_end;
                    inner_cl_loop_it++)
                {
                    int curve_type = compare_vector(main_cl_loop_it->second, inner_cl_loop_it->second);
                    switch (curve_type)
                    {
                    case 1/*identical*/:
                        cl_p_holder = inner_cl_loop_it; cl_p_holder--;
                        changes.insert({inner_cl_loop_it->first,main_cl_loop_it->first});
                        curve_loops_map.erase(inner_cl_loop_it->first);
                        inner_cl_loop_it = cl_p_holder;
                        inner_cl_loop_end = curve_loops_map.end();
                        main_cl_loop_end = std::prev(curve_loops_map.end());
                        break;
                    case 2/*reversed*/:
                        cl_p_holder = inner_cl_loop_it; cl_p_holder--;
                        changes.insert({inner_cl_loop_it->first,-main_cl_loop_it->first});
                        curve_loops_map.erase(inner_cl_loop_it->first);
                        inner_cl_loop_it = cl_p_holder;
                        inner_cl_loop_end = curve_loops_map.end();
                        main_cl_loop_end = std::prev(curve_loops_map.end());
                        break;
                    default:
                        break;
                    }
                }
            }
            adjust_curve_loops(changes);
            changes.clear();
        }
        // ------ Search for duplicated plane surfaces ------
        if (!plane_surfaces_map.empty())
        {
            auto main_ps_loop_end = std::prev(plane_surfaces_map.end());
            for (auto main_ps_loop_it = plane_surfaces_map.begin();
                main_ps_loop_it != main_ps_loop_end;
                main_ps_loop_it++)
            {
                auto inner_ps_loop_end = plane_surfaces_map.end();
                auto ps_p_holder = main_ps_loop_it; ps_p_holder++;
                for (auto inner_ps_loop_it = ps_p_holder;
                    inner_ps_loop_it != inner_ps_loop_end;
                    inner_ps_loop_it++)
                {
                    if (main_ps_loop_it->second == inner_ps_loop_it->second)
                    {
                        ps_p_holder = inner_ps_loop_it; ps_p_holder--;
                        changes.insert({ inner_ps_loop_it->first, main_ps_loop_it->first });
                        plane_surfaces_map.erase(inner_ps_loop_it->first);
                        inner_ps_loop_it = ps_p_holder;
                        inner_ps_loop_end = plane_surfaces_map.end();
                        main_ps_loop_end = std::prev(plane_surfaces_map.end());
                    }
                }
            }
            adjust_plane_surfaces(changes);
            changes.clear();
        }
        // ------ Search for duplicated surface loops -------
        if (!surface_loops_map.empty())
        {
            auto main_sur_loop_end = std::prev(surface_loops_map.end());
            for (auto main_sur_loop_it = surface_loops_map.begin();
                main_sur_loop_it != main_sur_loop_end;
                main_sur_loop_it++)
            {
                auto inner_sur_loop_end = surface_loops_map.end();
                auto sur_p_holder = main_sur_loop_it; sur_p_holder++;
                for (auto inner_sur_loop_it = sur_p_holder;
                    inner_sur_loop_it != inner_sur_loop_end;
                    inner_sur_loop_it++)
                {
                    int curve_type = compare_vector(main_sur_loop_it->second, inner_sur_loop_it->second);
                    switch (curve_type)
                    {
                    case 1/*identical*/:
                        sur_p_holder = inner_sur_loop_it; sur_p_holder--;
                        changes.insert({inner_sur_loop_it->first,main_sur_loop_it->first});
                        curve_loops_map.erase(inner_sur_loop_it->first);
                        inner_sur_loop_it = sur_p_holder;
                        inner_sur_loop_end = surface_loops_map.end();
                        main_sur_loop_end = std::prev(surface_loops_map.end());
                        break;
                    case 2/*reversed*/:
                        sur_p_holder = inner_sur_loop_it; sur_p_holder--;
                        changes.insert({inner_sur_loop_it->first,-main_sur_loop_it->first});
                        curve_loops_map.erase(inner_sur_loop_it->first);
                        inner_sur_loop_it = sur_p_holder;
                        inner_sur_loop_end = surface_loops_map.end();
                        main_sur_loop_end = std::prev(surface_loops_map.end());
                        break;
                    default:
                        break;
                    }
                }
            }
            adjust_surface_loops(changes);
            changes.clear();
        }
        // --- Search for duplicated physical elemements ----
        // Physical Curves
        auto pc_m_end = physical_curves_map.end();
        for ( auto i = physical_curves_map.begin();
            i != pc_m_end;
            i++)
        {
            std::sort(i->second.begin(),i->second.end());
            i->second.erase( unique(i->second.begin(),i->second.end() ), i->second.end());
        }
        // Physical Surfaces
        auto ps_m_end = physical_surfaces_map.end();
        for ( auto i = physical_surfaces_map.begin();
            i != ps_m_end;
            i++)
        {
            std::sort(i->second.begin(),i->second.end());
            i->second.erase( unique(i->second.begin(),i->second.end() ), i->second.end());
        }
        // Physical Volumes
        auto pv_m_end = physical_volumes_map.end();
        for ( auto i = physical_volumes_map.begin();
            i != pv_m_end;
            i++)
        {
            std::sort(i->second.begin(),i->second.end());
            i->second.erase( unique(i->second.begin(),i->second.end() ), i->second.end());
        }
    }
}